

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.h
# Opt level: O1

cmCommand * __thiscall cmCTestMemCheckCommand::Clone(cmCTestMemCheckCommand *this)

{
  pointer pcVar1;
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0xa8);
  cmCTestTestCommand::cmCTestTestCommand((cmCTestTestCommand *)this_00);
  (((cmCTestHandlerCommand *)&this_00->_vptr_cmCommand)->super_cmCTestCommand).super_cmCommand.
  _vptr_cmCommand = (_func_int **)&PTR__cmCTestHandlerCommand_00787e70;
  *(char **)(this_00[2].Error._M_dataplus._M_p + 0xb0) = "DEFECT_COUNT";
  pcVar1 = this_00[2].Error._M_dataplus._M_p;
  pcVar1[0xb8] = '\0';
  pcVar1[0xb9] = '\0';
  pcVar1[0xba] = '\0';
  pcVar1[0xbb] = '\0';
  pcVar1[0xbc] = '\0';
  pcVar1[0xbd] = '\0';
  pcVar1[0xbe] = '\0';
  pcVar1[0xbf] = '\0';
  this_00[3].Error._M_dataplus._M_p = (pointer)0x17;
  this_00[1]._vptr_cmCommand =
       (_func_int **)
       (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  this_00[1].Makefile =
       (cmMakefile *)
       (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
       CTestScriptHandler;
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestMemCheckCommand* ni = new cmCTestMemCheckCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }